

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

int __thiscall
clunk::Node::Search<(clunk::NodeType)1,false>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  HashEntry *this_00;
  uint32_t uVar1;
  int iVar2;
  Node *pNVar3;
  Move MVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint32_t beta_00;
  int iVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  int beta_01;
  Move *pMVar14;
  char cVar15;
  Move *pMVar16;
  Move *pMVar17;
  Move *pMVar18;
  uint uVar19;
  Move *pMVar20;
  int iVar21;
  Move firstMove;
  uint32_t local_70;
  uint32_t local_6c;
  uint local_64;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  uVar7 = -alpha;
  if (0 < alpha) {
    uVar7 = alpha;
  }
  if (32000 < uVar7) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  uVar7 = -beta;
  if (0 < beta) {
    uVar7 = beta;
  }
  if (32000 < uVar7) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (alpha + 1 != beta) {
    __assert_fail("(type == PV) | ((alpha + 1) == beta)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf73,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if ((cutNode) && (bVar5 = Move::IsValid(&this->lastMove), !bVar5)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar5 = HasRepeated(this), bVar5)) {
    iVar6 = _drawScore;
    this->standPat = _drawScore;
    return iVar6;
  }
  iVar6 = this->ply;
  uVar11 = iVar6 - 32000;
  if (alpha < (int)uVar11) {
    alpha = uVar11;
  }
  beta_00 = 0x7d01U - iVar6;
  if (beta <= (int)(0x7d01U - iVar6)) {
    beta_00 = beta;
  }
  if (this->child == (Node *)0x0 || (int)beta_00 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  if (DAT_0017fcd0 == 0) {
    __assert_fail("keyMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf7,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  if (DAT_0017fcd8 == 0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf8,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  _tt = _tt + 1;
  lVar9 = (DAT_0017fcd0 & this->positionKey) * 0x10;
  this_00 = (HashEntry *)(DAT_0017fcd8 + lVar9);
  iVar21 = 32000;
  if (*(ulong *)(DAT_0017fcd8 + lVar9) == this->positionKey) {
    DAT_0017fcb8 = DAT_0017fcb8 + 1;
    switch(this_00->flags & 7) {
    case 1:
      goto switchD_00137565_caseD_1;
    case 2:
      goto switchD_00137565_caseD_2;
    case 3:
      uVar11 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar11,iVar6);
      iVar6 = ValidateMove<false>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar21 = firstMove.score;
      if (firstMove.score <= alpha && depth <= (int)(uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      uVar11 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar11,iVar6);
      iVar6 = ValidateMove<false>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      if ((this_00->flags & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      if (depth <= (int)(uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)beta_00) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      iVar21 = firstMove.score;
      break;
    case 5:
      uVar11 = this_00->moveBits;
      iVar6 = HashEntry::Score(this_00,iVar6);
      Move::Init(&firstMove,uVar11,iVar6);
      iVar6 = ValidateMove<false>(this,&firstMove);
      if (iVar6 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar21 = 32000;
      if ((depth <= (int)(uint)this_00->depth) && ((int)beta_00 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    if (((this->depthChange < 1) && (this->parent->depthChange < 1)) && ((this_00->flags & 8) != 0))
    {
      _stats._80_8_ = _stats._80_8_ + 1;
      this->depthChange = this->depthChange + 1;
      depth = depth + 1;
    }
  }
  if (this->depthChange < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if ((((this->depthChange == 0 && this->checks == 0) && cutNode) &&
      (uVar1 = (this->lastMove).bits, uVar1 != this->killer[0].bits)) &&
     ((uVar1 != this->killer[1].bits &&
      ((1 < DAT_001698f0 + _pcount && (2 < DAT_001698f0 + _pcount + DAT_001698e8)))))) {
    if (alpha + 1U != beta_00) {
      __assert_fail("(alpha + 1) == beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfe0,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    Evaluate(this);
    if (this->standPat < iVar21) {
      iVar21 = this->standPat;
    }
    if (depth == 1) {
      uVar7 = -beta_00;
      if (0 < (int)beta_00) {
        uVar7 = beta_00;
      }
      if ((uVar7 < 20000) && ((int)(beta_00 + 300) <= iVar21)) {
        _stats._112_8_ = _stats._112_8_ + 1;
        this->depthChange = -1;
        return beta_00;
      }
    }
    else if ((int)beta_00 <= iVar21) {
      ExecNullMove<false>(this,this->child);
      iVar6 = ((depth - (uint)depth / 6) - (uint)((int)beta_00 <= iVar21 + -500)) + -3;
      if (iVar6 < 1) {
        iVar6 = QSearch<true>(this->child,-beta_00,-alpha,0);
      }
      else {
        iVar6 = Search<(clunk::NodeType)1,true>(this->child,-beta_00,-alpha,iVar6,false);
      }
      if (_stop == 0) {
        if (beta_00 == -iVar6 || SBORROW4(beta_00,-iVar6) != (int)(beta_00 + iVar6) < 0) {
          _stats._160_8_ = _stats._160_8_ + 1;
          this->depthChange = -depth;
          uVar11 = this->standPat;
          if (this->standPat <= (int)beta_00) {
            uVar11 = beta_00;
          }
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
      }
      else {
        bVar5 = false;
        uVar11 = beta_00;
      }
      local_70 = uVar11;
      if (!bVar5) {
        return uVar11;
      }
    }
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfff,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1000,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      if (this->pvCount != 0) {
        __assert_fail("!pvCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1015,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      GenerateMoves<false,false>(this,depth);
      uVar7 = this->moveCount;
      if ((int)uVar7 < 1) {
        if (this->checks != 0) {
          HashEntry::SetCheckmate(this_00,this->positionKey);
          DAT_0017fcc0 = DAT_0017fcc0 + 1;
          return this->ply + -32000;
        }
        HashEntry::SetStalemate(this_00,this->positionKey);
        DAT_0017fcc8 = DAT_0017fcc8 + 1;
switchD_00137565_caseD_2:
        iVar6 = _drawScore;
        this->standPat = _drawScore;
        return iVar6;
      }
      lVar9 = (long)this->moveIndex;
      if (lVar9 < 0) {
LAB_00138354:
        __assert_fail("moveIndex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x914,"Move *clunk::Node::GetNextMove()");
      }
      if (0x7f < uVar7) {
LAB_00138335:
        __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x915,"Move *clunk::Node::GetNextMove()");
      }
      pMVar14 = this->moves + lVar9;
      uVar12 = this->moveIndex + 1;
      pMVar17 = pMVar14;
      if ((int)uVar12 < (int)uVar7) {
        pMVar20 = this->moves + uVar12;
        pMVar16 = pMVar14;
        uVar13 = uVar12;
        do {
          pMVar17 = pMVar20;
          if (pMVar20->score <= pMVar16->score) {
            pMVar17 = pMVar16;
          }
          uVar13 = uVar13 + 1;
          pMVar20 = pMVar20 + 1;
          pMVar16 = pMVar17;
        } while ((int)uVar13 < (int)uVar7);
      }
      if (pMVar17 != pMVar14) {
        MVar4 = this->moves[lVar9];
        this->moves[lVar9].bits = pMVar17->bits;
        this->moves[lVar9].score = pMVar17->score;
        *pMVar17 = MVar4;
      }
      this->moveIndex = uVar12;
      Move::operator=(&firstMove,pMVar14);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
    }
  }
  else {
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x1005,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar6 = Search<(clunk::NodeType)1,false>(this,beta_00 - 1,beta_00,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar6;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    bVar5 = Move::IsValid(this->pv);
    if (!bVar5) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<false>(this,&firstMove,this->child);
  iVar6 = -beta_00;
  if (depth < 2) {
    uVar7 = QSearch<true>(this->child,iVar6,-alpha,0);
  }
  else {
    uVar7 = Search<(clunk::NodeType)1,true>(this->child,iVar6,-alpha,depth - 1,!cutNode);
  }
  Undo<false>(this,&firstMove);
  uVar11 = beta_00;
  if (_stop == 0) {
    uVar12 = this->child->depthChange;
    pMVar17 = this->pv;
    Move::operator=(pMVar17,&firstMove);
    pNVar3 = this->child;
    if (pNVar3 == (Node *)0x0) {
      this->pvCount = 1;
    }
    else {
      iVar21 = pNVar3->pvCount;
      this->pvCount = iVar21 + 1;
      if (0 < iVar21) {
        if (99 < iVar21) {
LAB_001386b8:
          __assert_fail("pvCount <= MaxPlies",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
        }
        memcpy(this->pv + 1,pNVar3->pv,(long)pNVar3->pvCount << 3);
      }
    }
    local_6c = -uVar7;
    local_64 = ((int)uVar12 >> 0x1f & uVar12) + depth;
    if (beta_00 == local_6c || SBORROW4(beta_00,local_6c) != (int)(beta_00 + uVar7) < 0) {
      if ((int)uVar12 < 0) {
        __assert_fail("pvDepth == depth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x103a,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      AddKiller(this,&firstMove,local_64);
      uVar12 = -uVar7;
      if (0 < (int)uVar7) {
        uVar12 = uVar7;
      }
      if (31000 < uVar12) {
        beta_00 = local_6c;
      }
      HashEntry::Set(this_00,this->positionKey,&firstMove,beta_00,this->ply,local_64,5,
                     (uint)(0 < this->depthChange) << 3);
      uVar11 = local_6c;
    }
    else {
      if (SBORROW4(alpha,local_6c) == (int)(alpha + uVar7) < 0) {
        uVar7 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar15 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar15 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar15 + -1;
        }
      }
      else {
        uVar7 = local_6c;
        if ((int)uVar12 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<false,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
      }
      if (1 < this->moveIndex) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      if (this->moveCount < this->moveIndex) {
        __assert_fail("moveIndex <= moveCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1053,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar2 = this->checks;
      iVar21 = depth - 1;
      uVar11 = local_70;
      do {
        do {
          iVar10 = this->moveIndex;
          lVar9 = (long)iVar10;
          if (lVar9 < 0) goto LAB_00138354;
          uVar12 = this->moveCount;
          if (0x7f < uVar12) goto LAB_00138335;
          if (iVar10 < (int)uVar12) {
            pMVar14 = this->moves + lVar9;
            uVar13 = iVar10 + 1;
            pMVar16 = pMVar14;
            if ((int)uVar13 < (int)uVar12) {
              pMVar18 = this->moves + uVar13;
              pMVar20 = pMVar14;
              uVar19 = uVar13;
              do {
                pMVar16 = pMVar18;
                if (pMVar18->score <= pMVar20->score) {
                  pMVar16 = pMVar20;
                }
                uVar19 = uVar19 + 1;
                pMVar18 = pMVar18 + 1;
                pMVar20 = pMVar16;
              } while ((int)uVar19 < (int)uVar12);
            }
            if (pMVar16 != pMVar14) {
              MVar4 = this->moves[lVar9];
              this->moves[lVar9].bits = pMVar16->bits;
              this->moves[lVar9].score = pMVar16->score;
              *pMVar16 = MVar4;
            }
            this->moveIndex = uVar13;
          }
          else {
            pMVar14 = (Move *)0x0;
          }
          if (pMVar14 == (Move *)0x0) {
            if (uVar12 == 0) {
              __assert_fail("moveCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a3,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if ((int)uVar7 < (int)local_6c) {
              __assert_fail("best <= alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a4,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if ((int)beta_00 <= (int)uVar7) {
              __assert_fail("alpha < beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a5,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if (this->pvCount < 1) {
              return local_6c;
            }
            if ((int)local_64 < 0) {
              __assert_fail("pvDepth >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a8,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            bVar5 = Move::IsValid(pMVar17);
            if (bVar5) {
              uVar12 = this->pv[0].bits;
              if (((uVar12 & 0xf) != 3 && (uVar12 & 0xff00000) == 0) && this->checks == 0) {
                IncHistory(pMVar17,depth);
              }
              if ((int)local_6c <= alpha) {
                if (uVar7 == alpha) {
                  HashEntry::Set(this_00,this->positionKey,pMVar17,uVar7,this->ply,local_64,3,
                                 (uint)(0 < this->depthChange) << 3);
                  return local_6c;
                }
                __assert_fail("alpha == orig_alpha",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10b6,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                             );
              }
              __assert_fail("pvNode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10ae,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            __assert_fail("pv[0].IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a9,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                         );
          }
          bVar5 = Move::IsValid(pMVar14);
          if (!bVar5) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                         );
          }
        } while (firstMove.bits == pMVar14->bits);
        _stats._192_8_ = _stats._192_8_ + 1;
        Exec<false>(this,pMVar14,this->child);
        iVar10 = iVar21;
        if (iVar2 == 0 && 2 < depth) {
          _stats._200_8_ = _stats._200_8_ + 1;
          uVar12 = pMVar14->bits;
          if ((((uVar12 != this->killer[1].bits && uVar12 != this->killer[0].bits) &&
               ((uVar12 & 0xf) != 3 && (uVar12 & 0xff00000) == 0)) && this->child->checks == 0) &&
             ((char)_hist[uVar12 & 0xfff] < depth)) {
            _stats._208_8_ = _stats._208_8_ + 1;
            iVar10 = ~(uint)((byte)_hist[uVar12 & 0xfff] >> 7) + iVar21;
          }
        }
        beta_01 = -uVar7;
        if (iVar10 < 1) {
          iVar8 = QSearch<true>(this->child,~uVar7,beta_01,0);
        }
        else {
          iVar8 = Search<(clunk::NodeType)1,true>(this->child,~uVar7,beta_01,iVar10,true);
        }
        local_70 = -iVar8;
        if ((SBORROW4(uVar7,local_70) != (int)(uVar7 + iVar8) < 0) && (_stop == 0)) {
          if (this->child->depthChange < 0) {
            __assert_fail("child->depthChange >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1074,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                         );
          }
          _stats._232_8_ = _stats._232_8_ + 1;
          if (iVar10 < iVar21) {
            if (uVar7 + 1 != beta_00) {
              __assert_fail("(alpha + 1) == beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x107e,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            _stats._216_8_ = _stats._216_8_ + 1;
            iVar10 = Search<(clunk::NodeType)1,true>(this->child,iVar6,beta_01,iVar21,false);
            local_70 = -iVar10;
          }
          _stats._224_8_ = _stats._224_8_ + (ulong)((int)uVar7 < (int)local_70);
        }
        if (this->child->depthChange <= ~depth) {
          __assert_fail("(depth + child->depthChange) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1086,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
        Undo<false>(this,pMVar14);
        if (_stop == 0) {
          if ((int)local_6c < (int)local_70) {
            uVar12 = this->child->depthChange;
            Move::operator=(pMVar17,pMVar14);
            pNVar3 = this->child;
            if (pNVar3 == (Node *)0x0) {
              this->pvCount = 1;
            }
            else {
              iVar10 = pNVar3->pvCount;
              this->pvCount = iVar10 + 1;
              if (0 < iVar10) {
                if (99 < iVar10) goto LAB_001386b8;
                memcpy(this->pv + 1,pNVar3->pv,(long)pNVar3->pvCount << 3);
              }
            }
            local_64 = ((int)uVar12 >> 0x1f & uVar12) + depth;
            if ((int)beta_00 <= (int)local_70) {
              if ((int)uVar12 < 0) {
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1090,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                             );
              }
              AddKiller(this,pMVar14,local_64);
              local_6c = local_70;
              uVar12 = -local_70;
              if (0 < (int)local_70) {
                uVar12 = local_70;
              }
              uVar11 = beta_00;
              if (31000 < uVar12) {
                uVar11 = local_70;
              }
              HashEntry::Set(this_00,this->positionKey,pMVar14,uVar11,this->ply,local_64,5,
                             (uint)(0 < this->depthChange) << 3);
              bVar5 = false;
              uVar11 = local_70;
              goto LAB_00137fd1;
            }
            local_6c = local_70;
          }
          if ((int)uVar7 < (int)local_70) {
            bVar5 = true;
            uVar7 = local_70;
            if (local_64 != depth) {
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x109b,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
          }
          else {
            uVar12 = pMVar14->bits;
            bVar5 = true;
            if (((uVar12 & 0xf) != 3 && (uVar12 & 0xff00000) == 0) && this->checks == 0) {
              cVar15 = _hist[uVar12 & 0xfff];
              if ((char)_hist[uVar12 & 0xfff] < '\0') {
                cVar15 = -1;
              }
              _hist[uVar12 & 0xfff] = cVar15 + -1;
            }
          }
        }
        else {
          bVar5 = false;
          uVar11 = beta_00;
        }
LAB_00137fd1:
      } while (bVar5);
    }
  }
switchD_00137565_caseD_1:
  return uVar11;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }